

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O1

void __thiscall FuncInfo::Dump(FuncInfo *this)

{
  uint uVar1;
  char16_t *pcVar2;
  char16_t *pcVar3;
  char16_t *pcVar4;
  char16_t *pcVar5;
  
  uVar1 = *(uint *)&this->field_0xb4;
  pcVar2 = L"LdTrue";
  pcVar3 = L"LdTrue";
  if ((uVar1 & 2) == 0) {
    pcVar3 = L"LdFalse";
  }
  pcVar4 = L"LdTrue";
  if ((uVar1 & 4) == 0) {
    pcVar4 = L"LdFalse";
  }
  pcVar5 = L"LdTrue";
  if ((uVar1 & 8) == 0) {
    pcVar5 = L"LdFalse";
  }
  if ((uVar1 & 0x10) == 0) {
    pcVar2 = L"LdFalse";
  }
  Output::Print(L"FuncInfo: CallsEval:%s ChildCallsEval:%s HasArguments:%s HasHeapArguments:%s\n",
                pcVar3 + 2,pcVar4 + 2,pcVar5 + 2,pcVar2 + 2);
  return;
}

Assistant:

void FuncInfo::Dump()
{
    Output::Print(_u("FuncInfo: CallsEval:%s ChildCallsEval:%s HasArguments:%s HasHeapArguments:%s\n"),
        IsTrueOrFalse(this->GetCallsEval()),
        IsTrueOrFalse(this->GetChildCallsEval()),
        IsTrueOrFalse(this->GetHasArguments()),
        IsTrueOrFalse(this->GetHasHeapArguments()));
}